

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O1

void __thiscall CPubKey::Set<unsigned_char_const*>(CPubKey *this,uchar *pbegin,uchar *pend)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  size_t __n;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pend != pbegin) {
    bVar1 = *pbegin;
    __n = 0x21;
    bVar3 = 1;
    if (((bVar1 & 0xfe) == 2) || ((bVar1 < 8 && (__n = 0x41, (0xd0U >> (bVar1 & 0x1f) & 1) != 0))))
    goto LAB_00355e5c;
  }
  bVar3 = 0;
  __n = 0;
LAB_00355e5c:
  if ((bool)(bVar3 ^ 1) || (long)pend - (long)pbegin != __n) {
    this->vch[0] = 0xff;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    memcpy(this,pbegin,__n);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Set(const T pbegin, const T pend)
    {
        int len = pend == pbegin ? 0 : GetLen(pbegin[0]);
        if (len && len == (pend - pbegin))
            memcpy(vch, (unsigned char*)&pbegin[0], len);
        else
            Invalidate();
    }